

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
spirv_cross::join<char_const(&)[64]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [64])

{
  size_t len;
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1108 [4336];
  
  local_1108._4120_8_ = local_1108 + 0x1030;
  local_1108._16_8_ = 0;
  local_1108._0_8_ = (char *)0x0;
  local_1108._8_8_ = 0;
  local_1108._4128_8_ = 0;
  local_1108._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1108);
  len = strlen((char *)this);
  StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1108,(char *)this,len);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1108);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1108);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}